

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O1

void TPZBuildMultiphysicsMesh::ComputeAtomicIndexes
               (TPZCompMesh *mesh,TPZVec<std::pair<TPZCompMesh_*,_long>_> *indexes)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  long nelem;
  atomic_index def;
  
  lVar1 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  (*indexes->_vptr_TPZVec[2])
            (indexes,(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements);
  if (0 < lVar1) {
    nelem = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (*ppTVar2 != (TPZCompEl *)0x0) {
        FillAtomic(*ppTVar2,indexes);
      }
      nelem = nelem + 1;
    } while (lVar1 != nelem);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::ComputeAtomicIndexes(TPZCompMesh *mesh, TPZVec<atomic_index> &indexes)
{
    int64_t ncon = mesh->NConnects();
    int64_t nel = mesh->NElements();
    atomic_index def(0,-1);
    indexes.Resize(ncon, def);
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = mesh->Element(el);
        if(cel)
        {
            FillAtomic(cel, indexes);
        }
    }
#ifdef PZDEBUG
    {
        int notfound = 0;
        for (int64_t i=0; i<indexes.size(); i++) {
            if(mesh->ConnectVec()[i].SequenceNumber() < 0) continue;
            if(indexes[i].first == 0) notfound++;
        }
        if(notfound)
        {
            std::cout << __PRETTY_FUNCTION__ << " number of missing connects " << notfound << std::endl;
        }
    }
#endif
}